

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

int tx_elements_output_proof_init
              (wally_tx_output *output,uchar *surjectionproof,size_t surjectionproof_len,
              uchar *rangeproof,size_t rangeproof_len)

{
  uchar *__dest;
  int iVar1;
  uchar *local_38;
  
  if ((surjectionproof != (uchar *)0x0) == (surjectionproof_len == 0)) {
    return -2;
  }
  if ((rangeproof != (uchar *)0x0) == (rangeproof_len == 0)) {
    return -2;
  }
  if (surjectionproof_len == 0) {
    local_38 = (uchar *)0x0;
LAB_0017bad4:
    iVar1 = 0;
    if (rangeproof_len == 0) {
      __dest = (uchar *)0x0;
    }
    else {
      __dest = (uchar *)wally_malloc(rangeproof_len);
      if (__dest == (uchar *)0x0) goto LAB_0017bb1c;
      memcpy(__dest,rangeproof,rangeproof_len);
    }
    output->surjectionproof = local_38;
    output->surjectionproof_len = surjectionproof_len;
    output->rangeproof = __dest;
    output->rangeproof_len = rangeproof_len;
  }
  else {
    local_38 = (uchar *)wally_malloc(surjectionproof_len);
    if (local_38 != (uchar *)0x0) {
      memcpy(local_38,surjectionproof,surjectionproof_len);
      goto LAB_0017bad4;
    }
    local_38 = (uchar *)0x0;
LAB_0017bb1c:
    clear_and_free(local_38,surjectionproof_len);
    clear_and_free((void *)0x0,rangeproof_len);
    iVar1 = -3;
  }
  return iVar1;
}

Assistant:

static int tx_elements_output_proof_init(
    struct wally_tx_output *output,
    const unsigned char *surjectionproof,
    size_t surjectionproof_len,
    const unsigned char *rangeproof,
    size_t rangeproof_len)
{
#ifdef BUILD_ELEMENTS
    unsigned char *new_surjectionproof = NULL, *new_rangeproof = NULL;
#endif
    (void) output;

    if (BYTES_INVALID(surjectionproof, surjectionproof_len) ||
        BYTES_INVALID(rangeproof, rangeproof_len))
        return WALLY_EINVAL;

#ifdef BUILD_ELEMENTS
    if (!clone_bytes(&new_surjectionproof, surjectionproof, surjectionproof_len) ||
        !clone_bytes(&new_rangeproof, rangeproof, rangeproof_len)) {
        clear_and_free(new_surjectionproof,  surjectionproof_len);
        clear_and_free(new_rangeproof, rangeproof_len);
        return WALLY_ENOMEM;
    }

    output->surjectionproof = new_surjectionproof;
    output->surjectionproof_len = surjectionproof_len;
    output->rangeproof = new_rangeproof;
    output->rangeproof_len = rangeproof_len;
#endif
    return WALLY_OK;
}